

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_HeartGenerator.h
# Opt level: O1

void __thiscall
soul::HEARTGenerator::initialiseArrayOrStructElements
          (HEARTGenerator *this,Expression *target,
          ArrayView<soul::pool_ref<soul::AST::Expression>_> list,Context *errorLocation)

{
  char cVar1;
  Expression *e;
  Member *pMVar2;
  long lVar3;
  pool_ref<soul::AST::Expression> *ppVar4;
  bool bVar5;
  int iVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  Structure *pSVar7;
  ArrayElement *dest;
  undefined4 extraout_var_02;
  Expression *pEVar8;
  size_t numberAvailable;
  long lVar9;
  ulong uVar10;
  pool_ptr<soul::AST::Constant> constElement;
  ulong local_80;
  CodeLocation *local_78;
  Expression *local_70;
  pool_ref<soul::AST::Expression> *local_68;
  BlockBuilder *local_60;
  ulong local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  Type *type;
  
  local_68 = list.s;
  local_70 = target;
  iVar6 = (*(target->super_Object)._vptr_Object[2])(target);
  ppVar4 = local_68;
  type = (Type *)CONCAT44(extraout_var,iVar6);
  if (((type->category & ~wrap) != vector) && (type->category != array || type->boundingSize == 0))
  {
    throwInternalCompilerError
              ("targetType.isFixedSizeAggregate()","initialiseArrayOrStructElements",0x3f9);
  }
  numberAvailable = (long)list.e - (long)local_68 >> 3;
  SanityCheckPass::throwErrorIfWrongNumberOfElements(errorLocation,type,numberAvailable);
  pEVar8 = local_70;
  iVar6 = (*(local_70->super_Object)._vptr_Object[2])(local_70);
  cVar1 = *(char *)CONCAT44(extraout_var_00,iVar6);
  local_60 = &(this->builder).super_BlockBuilder;
  BlockBuilder::addZeroAssignment(local_60,pEVar8);
  if (list.e != ppVar4) {
    local_78 = &(pEVar8->super_Object).location;
    local_58 = numberAvailable + (numberAvailable == 0);
    lVar9 = 0x20;
    uVar10 = 0;
    do {
      e = local_68[uVar10].object;
      (*(e->super_Statement).super_ASTObject._vptr_ASTObject[0xd])(&local_80,e);
      if (local_80 == 0) {
LAB_00244d11:
        if (cVar1 == '\x06') {
          iVar6 = (*(pEVar8->super_Object)._vptr_Object[2])(pEVar8);
          pSVar7 = Type::getStructRef((Type *)CONCAT44(extraout_var_01,iVar6));
          if ((pSVar7->members).numActive <= uVar10) {
            throwInternalCompilerError("index < numActive","operator[]",0x9f);
          }
          pMVar2 = (pSVar7->members).items;
          local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
          lVar3 = *(long *)((long)pMVar2 + lVar9 + -8);
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_50,lVar3,*(long *)(&(pMVar2->type).category + lVar9) + lVar3);
          dest = (ArrayElement *)
                 PoolAllocator::
                 allocate<soul::heart::StructElement,soul::CodeLocation&,soul::heart::Expression&,std::__cxx11::string>
                           (&((this->builder).super_BlockBuilder.module)->allocator->pool,local_78,
                            pEVar8,&local_50);
        }
        else {
          local_80 = uVar10;
          dest = PoolAllocator::
                 allocate<soul::heart::ArrayElement,soul::CodeLocation&,soul::heart::Expression&,unsigned_long&>
                           (&((this->builder).super_BlockBuilder.module)->allocator->pool,local_78,
                            pEVar8,&local_80);
        }
        iVar6 = (*(dest->super_Expression).super_Object._vptr_Object[2])(dest);
        pEVar8 = evaluateAsExpression(this,e,(Type *)CONCAT44(extraout_var_02,iVar6));
        BlockBuilder::addAssignment(local_60,&dest->super_Expression,pEVar8);
        pEVar8 = local_70;
        if ((cVar1 == '\x06') &&
           ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2)) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
      }
      else {
        bVar5 = soul::Value::isZero((Value *)(local_80 + 0x30));
        if (!bVar5) goto LAB_00244d11;
      }
      uVar10 = uVar10 + 1;
      lVar9 = lVar9 + 0x40;
    } while (local_58 != uVar10);
  }
  return;
}

Assistant:

void initialiseArrayOrStructElements (heart::Expression& target, ArrayView<pool_ref<AST::Expression>> list,
                                          const AST::Context& errorLocation)
    {
        const auto& targetType = target.getType();
        SOUL_ASSERT (targetType.isFixedSizeAggregate());
        SanityCheckPass::throwErrorIfWrongNumberOfElements (errorLocation, targetType, list.size());
        bool isStruct = target.getType().isStruct();

        builder.addZeroAssignment (target);

        for (size_t i = 0; i < list.size(); ++i)
        {
            auto& sourceValue = list[i].get();

            if (auto constElement = sourceValue.getAsConstant())
                if (constElement->value.isZero()) // no need to assign to elements which are zero
                    continue;

            createAssignment (isStruct ? (heart::Expression&) builder.createStructElement (target, target.getType().getStructRef().getMemberName (i))
                                       : (heart::Expression&) builder.createFixedArrayElement (target, i),
                              sourceValue);
        }
    }